

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O3

int slu_mmdint_(int *neqns,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = *neqns;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      dhead[uVar5] = 0;
      qsize[uVar5] = 1;
      marker[uVar5] = 0;
      llist[uVar5] = 0;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar1 = *neqns;
    if (0 < (int)uVar1) {
      lVar3 = 1;
      do {
        lVar4 = (long)xadj[lVar3] - (long)xadj[lVar3 + -1];
        iVar2 = dhead[lVar4];
        dforw[lVar3 + -1] = iVar2;
        dhead[lVar4] = (shortint)lVar3;
        if (0 < (long)iVar2) {
          dbakw[(long)iVar2 + -1] = (shortint)lVar3;
        }
        dbakw[lVar3 + -1] = ~(uint)lVar4;
        lVar3 = lVar3 + 1;
      } while ((ulong)uVar1 + 1 != lVar3);
    }
  }
  return 0;
}

Assistant:

int slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
	shortint *dhead, int *dforw, int *dbakw, shortint *qsize, 
	shortint *llist, shortint *marker)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int ndeg, node, fnode;

/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	dhead[node] = 0;
	qsize[node] = 1;
	marker[node] = 0;
	llist[node] = 0;
/* L100: */
    }
/*        ------------------------------------------ */
/*        INITIALIZE THE DEGREE DOUBLY LINKED LISTS. */
/*        ------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	ndeg = xadj[node + 1] - xadj[node] + 1;
	fnode = dhead[ndeg];
	dforw[node] = fnode;
	dhead[ndeg] = node;
	if (fnode > 0) {
	    dbakw[fnode] = node;
	}
	dbakw[node] = -ndeg;
/* L200: */
    }
    return 0;

}